

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VertexBuffer.cpp
# Opt level: O1

VertexBuffer * __thiscall sf::VertexBuffer::operator=(VertexBuffer *this,VertexBuffer *right)

{
  uint uVar1;
  PrimitiveType PVar2;
  Usage UVar3;
  size_t sVar4;
  VertexBuffer temp;
  VertexBuffer local_30;
  
  VertexBuffer(&local_30,right);
  sVar4 = this->m_size;
  this->m_size = local_30.m_size;
  uVar1 = this->m_buffer;
  this->m_buffer = local_30.m_buffer;
  PVar2 = this->m_primitiveType;
  this->m_primitiveType = local_30.m_primitiveType;
  UVar3 = this->m_usage;
  this->m_usage = local_30.m_usage;
  local_30.m_buffer = uVar1;
  local_30.m_size = sVar4;
  local_30.m_primitiveType = PVar2;
  local_30.m_usage = UVar3;
  ~VertexBuffer(&local_30);
  return this;
}

Assistant:

VertexBuffer& VertexBuffer::operator =(const VertexBuffer& right)
{
    VertexBuffer temp(right);

    swap(temp);

    return *this;
}